

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O2

void cjson_delete_item_from_array_should_not_broken_list_structure(void)

{
  cJSON *object;
  cJSON *array;
  cJSON *item;
  cJSON *item_00;
  char *pcVar1;
  long in_FS_OFFSET;
  char expected_json3 [21];
  char expected_json2 [33];
  char expected_json1 [21];
  char local_a8 [32];
  char local_88 [48];
  char local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  builtin_strncpy(local_58,"{\"rd\":[{\"a\":\"123\"}]}",0x15);
  builtin_strncpy(local_88 + 0x10,"\"},{\"b\":\"456\"}]}",0x11);
  builtin_strncpy(local_88,"{\"rd\":[{\"a\":\"123",0x10);
  builtin_strncpy(local_a8,"{\"rd\":[{\"b\":\"456\"}]}",0x15);
  object = cJSON_Parse("{}");
  array = cJSON_AddArrayToObject(object,"rd");
  item = cJSON_Parse("{\"a\":\"123\"}");
  item_00 = cJSON_Parse("{\"b\":\"456\"}");
  add_item_to_array(array,item);
  pcVar1 = cJSON_PrintUnformatted(object);
  UnityAssertEqualString(local_58,pcVar1,(char *)0x0,0x259);
  free(pcVar1);
  add_item_to_array(array,item_00);
  pcVar1 = cJSON_PrintUnformatted(object);
  UnityAssertEqualString(local_88,pcVar1,(char *)0x0,0x25e);
  free(pcVar1);
  cJSON_DeleteItemFromArray(array,0);
  pcVar1 = cJSON_PrintUnformatted(object);
  UnityAssertEqualString(local_a8,pcVar1,(char *)0x0,0x264);
  free(pcVar1);
  cJSON_Delete(object);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void cjson_delete_item_from_array_should_not_broken_list_structure(void)
{
    const char expected_json1[] = "{\"rd\":[{\"a\":\"123\"}]}";
    const char expected_json2[] = "{\"rd\":[{\"a\":\"123\"},{\"b\":\"456\"}]}";
    const char expected_json3[] = "{\"rd\":[{\"b\":\"456\"}]}";
    char *str1 = NULL;
    char *str2 = NULL;
    char *str3 = NULL;

    cJSON *root = cJSON_Parse("{}");

    cJSON *array = cJSON_AddArrayToObject(root, "rd");
    cJSON *item1 = cJSON_Parse("{\"a\":\"123\"}");
    cJSON *item2 = cJSON_Parse("{\"b\":\"456\"}");

    cJSON_AddItemToArray(array, item1);
    str1 = cJSON_PrintUnformatted(root);
    TEST_ASSERT_EQUAL_STRING(expected_json1, str1);
    free(str1);

    cJSON_AddItemToArray(array, item2);
    str2 = cJSON_PrintUnformatted(root);
    TEST_ASSERT_EQUAL_STRING(expected_json2, str2);
    free(str2);

    /* this should not broken list structure */
    cJSON_DeleteItemFromArray(array, 0);
    str3 = cJSON_PrintUnformatted(root);
    TEST_ASSERT_EQUAL_STRING(expected_json3, str3);
    free(str3);

    cJSON_Delete(root);
}